

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O0

ComplexPair * __thiscall Iir::BandStopTransform::transform(BandStopTransform *this,complex_t c)

{
  bool bVar1;
  complex<double> *in_RSI;
  ComplexPair *in_RDI;
  double dVar2;
  complex_t d;
  complex_t v;
  complex_t u;
  ComplexPair *this_00;
  complex<double> *in_stack_fffffffffffffef0;
  complex<double> *in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff08;
  complex<double> *in_stack_ffffffffffffff10;
  complex<double> *in_stack_ffffffffffffff28;
  complex<double> *in_stack_ffffffffffffff30;
  undefined1 local_a8 [24];
  double local_90;
  double local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 local_50;
  complex<double> local_10;
  
  this_00 = in_RDI;
  infinity();
  bVar1 = std::operator==(in_stack_fffffffffffffef0,in_RSI);
  if (bVar1) {
    std::complex<double>::operator=(&local_10,-1.0);
  }
  else {
    local_50 = 0x3ff0000000000000;
    std::operator+((double *)in_RDI,(complex<double> *)0x106e59);
    local_68 = 0x3ff0000000000000;
    std::operator-((double *)this_00,(complex<double> *)in_RDI);
    std::operator/((complex<double> *)in_RDI,(complex<double> *)0x106eb8);
  }
  std::complex<double>::complex((complex<double> *)local_78,0.0,0.0);
  dVar2 = (*(double *)(in_RSI[2]._M_value + 8) + *(double *)in_RSI[2]._M_value) - 1.0;
  addmul<double,double>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_80 = dVar2;
  local_78._8_8_ = dVar2;
  std::complex<double>::operator+=
            ((complex<double> *)local_78,
             ((*(double *)(in_RSI[2]._M_value + 8) - *(double *)in_RSI[2]._M_value) + 1.0) * 8.0);
  std::complex<double>::operator*=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  dVar2 = (*(double *)in_RSI[2]._M_value + *(double *)(in_RSI[2]._M_value + 8)) - 1.0;
  std::complex<double>::operator+=((complex<double> *)local_78,dVar2 * 4.0);
  std::sqrt<double>(in_stack_fffffffffffffef0);
  local_90 = dVar2;
  local_78._8_8_ = dVar2;
  std::operator*((complex<double> *)in_RDI,(double *)0x107047);
  local_a8._8_8_ = dVar2;
  std::complex<double>::operator+=((complex<double> *)local_a8,*(double *)in_RSI[1]._M_value);
  addmul<double,double>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_a8._8_8_ = dVar2;
  std::complex<double>::operator*=((complex<double> *)local_78,0.5);
  std::complex<double>::operator+=((complex<double> *)local_78,*(double *)in_RSI[1]._M_value);
  addmul<double,double>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_78._8_8_ = dVar2;
  std::complex<double>::complex
            ((complex<double> *)&stack0xffffffffffffff20,*(double *)(in_RSI[1]._M_value + 8) + 1.0,
             0.0);
  addmul<double,double>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::operator/((complex<double> *)in_RDI,(complex<double> *)0x1071cd);
  std::operator/((complex<double> *)in_RDI,(complex<double> *)0x1071eb);
  ComplexPair::ComplexPair(this_00,(complex_t *)in_RDI,(complex_t *)0x10720a);
  return this_00;
}

Assistant:

ComplexPair BandStopTransform::transform (complex_t c)
{
	if (c == infinity())
		c = -1;
	else
		c = (1. + c) / (1. - c); // bilinear
	
	complex_t u (0);
	u = addmul (u, 4 * (b2 + a2 - 1), c);
	u += 8 * (b2 - a2 + 1);
	u *= c;
	u += 4 * (a2 + b2 - 1);
	u = std::sqrt (u);
	
	complex_t v = u * -.5;
	v += a;
	v = addmul (v, -a, c);
	
	u *= .5;
	u += a;
	u = addmul (u, -a, c);
	
	complex_t d (b + 1);
	d = addmul (d, b-1, c);
	
	return ComplexPair (u/d, v/d);
}